

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O2

bool updateScatterData(double value0,double value1,HighsScatterData *scatter_data)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = 0.0 < value0 && 0.0 < value1;
  if (bVar3) {
    scatter_data->num_point_ = scatter_data->num_point_ + 1;
    iVar1 = scatter_data->last_point_ + 1;
    iVar2 = 0;
    if (iVar1 != scatter_data->max_num_point_) {
      iVar2 = iVar1;
    }
    scatter_data->last_point_ = iVar2;
    (scatter_data->value0_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2] = value0;
    (scatter_data->value1_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2] = value1;
  }
  return bVar3;
}

Assistant:

bool updateScatterData(const double value0, const double value1,
                       HighsScatterData& scatter_data) {
  if (value0 <= 0 || value1 <= 0) return false;
  scatter_data.num_point_++;
  scatter_data.last_point_++;
  if (scatter_data.last_point_ == scatter_data.max_num_point_)
    scatter_data.last_point_ = 0;
  scatter_data.value0_[scatter_data.last_point_] = value0;
  scatter_data.value1_[scatter_data.last_point_] = value1;
  return true;
}